

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bareNEST.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  long *plVar11;
  VDetector *this;
  RandomGen *pRVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  vector<double,_std::allocator<double>_> scint;
  vector<double,_std::allocator<double>_> scint2;
  vector<double,_std::allocator<double>_> wf_amp;
  vector<long,_std::allocator<long>_> wf_time;
  vector<double,_std::allocator<double>_> g2_params;
  QuantaResult quanta;
  YieldResult yields;
  NESTcalc n;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  undefined4 local_3d8;
  double local_3c0;
  double local_3b8;
  double local_3a0;
  vector<double,_std::allocator<double>_> local_398;
  vector<double,_std::allocator<double>_> local_380;
  YieldResult local_368;
  vector<long,_std::allocator<long>_> local_338;
  double local_318;
  vector<double,_std::allocator<double>_> local_310;
  undefined8 local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  YieldResult local_2d8;
  NESTcalc local_2a0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "NOTE: This is a skeleton code meant to be a starting point for custom uses of NEST. But you should really look at execNEST."
             ,0x7b);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  plVar11 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  this = (VDetector *)operator_new(0x128);
  VDetector::VDetector(this);
  this->_vptr_VDetector = (_func_int **)&PTR__VDetector_00119bf0;
  DetectorExample_LUX_RUN03::Initialization((DetectorExample_LUX_RUN03 *)this);
  NEST::NESTcalc::NESTcalc(&local_2a0,this);
  pRVar12 = RandomGen::rndm();
  RandomGen::SetSeed(pRVar12,0);
  pRVar12 = RandomGen::rndm();
  local_3f0 = RandomGen::rand_uniform(pRVar12);
  dVar3 = NEST::NESTcalc::SetDensity(&local_2a0,this->T_Kelvin,this->p_bar);
  if (dVar3 < 1.0) {
    this->inGas = true;
  }
  NEST::NESTcalc::CalculateG2(&local_310,&local_2a0,1);
  dVar1 = local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  NEST::NESTcalc::SetDriftVelocity_NonUniform
            ((vector<double,_std::allocator<double>_> *)&local_368,&local_2a0,dVar3,z_step,
             this->T_Kelvin,this->p_bar,in_XMM4_Qa,in_XMM5_Qa);
  dVar10 = local_368.ExcitonRatio;
  dVar9 = local_368.PhotonYield;
  dVar8 = local_3f0 * 90.0 + 10.0;
  dVar2 = 100.0;
  if (dVar8 <= 100.0) {
    dVar2 = dVar8;
  }
  local_3b8 = 10.0;
  if (10.0 <= dVar2) {
    local_3b8 = dVar2;
  }
  dVar8 = floor(((this->gate + -100.0 + this->cathode + 1.5) * 0.5) / z_step + 0.5);
  local_318 = *(double *)((long)dVar9 + (long)(int)dVar8 * 8);
  dVar8 = -999.0;
  while( true ) {
    if ((((this->dt_min <= dVar8) && (0.0 < local_3f0)) &&
        (dVar8 < this->dt_max || dVar8 == this->dt_max)) &&
       (local_3f0 < this->TopDrift || local_3f0 == this->TopDrift)) break;
    dVar8 = this->TopDrift;
    pRVar12 = RandomGen::rndm();
    dVar4 = RandomGen::rand_uniform(pRVar12);
    dVar2 = this->radius;
    pRVar12 = RandomGen::rndm();
    dVar5 = RandomGen::rand_uniform(pRVar12);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    pRVar12 = RandomGen::rndm();
    dVar6 = RandomGen::rand_uniform(pRVar12);
    local_3f0 = dVar8 * dVar4 + 0.0;
    dVar2 = dVar2 * dVar5;
    dVar8 = cos(dVar6 * 6.283185307179586);
    local_3e0 = dVar8 * dVar2;
    dVar8 = sin(dVar6 * 6.283185307179586);
    local_3c0 = dVar8 * dVar2;
    (*this->_vptr_VDetector[4])(SUB84(local_3e0,0),SUB84(local_3c0,0),SUB84(local_3f0,0),this);
    local_3e8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    dVar8 = floor(local_3f0 / z_step + 0.5);
    local_3a0 = *(double *)((long)dVar9 + (long)(int)dVar8 * 8);
    dVar8 = (this->TopDrift - local_3f0) / local_3a0;
  }
  NEST::NESTcalc::GetYields
            (&local_368,&local_2a0,NR,local_3b8,dVar3,local_3e8,0.0,0.0,&default_NRYieldsParam,
             &default_ERYieldsParam);
  local_2d8.ElectricField = local_368.ElectricField;
  local_2d8.DeltaT_Scint = local_368.DeltaT_Scint;
  local_2d8.ExcitonRatio = local_368.ExcitonRatio;
  local_2d8.Lindhard = local_368.Lindhard;
  local_2d8.PhotonYield = local_368.PhotonYield;
  local_2d8.ElectronYield = local_368.ElectronYield;
  NEST::NESTcalc::GetQuanta
            ((QuantaResult *)&local_368,&local_2a0,&local_2d8,dVar3,&default_NRERWidthsParam,-999.0)
  ;
  local_2e8 = local_368.ExcitonRatio;
  dStack_2e0 = local_368.Lindhard;
  local_2f8 = (void *)local_368.PhotonYield;
  dStack_2f0 = local_368.ElectronYield;
  exp(-dVar8 / this->eLife_us);
  local_368.ExcitonRatio = 0.0;
  local_368.PhotonYield = 0.0;
  local_368.ElectronYield = 0.0;
  local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pvVar13 = NEST::NESTcalc::GetS1
                      (&local_2a0,(QuantaResult *)&local_2f8,local_3e0,local_3c0,local_3f0,local_3e0
                       ,local_3c0,local_3f0,local_3a0,local_318,NR,0,local_3e8,local_3b8,
                       s1CalculationMode,verbosity,&local_338,
                       (vector<double,_std::allocator<double>_> *)&local_368);
  std::vector<double,_std::allocator<double>_>::vector(&local_398,pvVar13);
  if (local_3f0 < this->cathode) {
    local_2f8 = (void *)((ulong)local_2f8 & 0xffffffff);
  }
  pvVar13 = NEST::NESTcalc::GetS2
                      (&local_2a0,local_2f8._4_4_,local_3e0,local_3c0,local_3f0,local_3e0,local_3c0,
                       local_3f0,dVar8,local_3a0,0,local_3e8,s2CalculationMode,verbosity,&local_338,
                       (vector<double,_std::allocator<double>_> *)&local_368,&local_310);
  std::vector<double,_std::allocator<double>_>::vector(&local_380,pvVar13);
  if (MCtruthE == false) {
    dVar3 = this->g1;
    if (usePD == 1) {
      uVar14 = SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[5],0);
      uVar15 = (undefined4)
               ((ulong)local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[5] >> 0x20);
LAB_00103f2f:
      uVar7 = CONCAT44(uVar15,uVar14) & 0x7fffffffffffffff;
      uVar14 = (undefined4)uVar7;
      uVar15 = (undefined4)(uVar7 >> 0x20);
    }
    else {
      if (usePD != 0) {
        uVar14 = SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[7],0);
        uVar15 = (undefined4)
                 ((ulong)local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[7] >> 0x20);
        goto LAB_00103f2f;
      }
      uVar14 = SUB84(ABS(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[3]),0);
      uVar15 = (undefined4)
               ((ulong)ABS(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[3]) >> 0x20);
      dVar3 = dVar3 * (this->P_dphe + 1.0);
    }
    dVar3 = (double)CONCAT44(uVar15,uVar14) / dVar3;
    if (usePD == 0) {
      dVar1 = ABS(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[5]) / (dVar1 * (this->P_dphe + 1.0));
    }
    else {
      dVar1 = ABS(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[7]) / dVar1;
    }
    local_3b8 = (double)(-(ulong)(0.0 < dVar3) &
                        -(ulong)(2.2250738585072014e-308 < local_2d8.Lindhard) &
                        -(ulong)(0.0 < dVar1) &
                        (ulong)(((dVar3 + dVar1) * 13.4 * 0.001) / local_2d8.Lindhard));
  }
  fwrite("\nE [keV]\t\tfield [V/cm]\ttDrift [us]\tX,Y,Z [mm]\tNph\tNe-\tS1 [PE or phe]\tS1_3Dcor [phd]\tS1c_spike\tNe-Extr\tS2_rawArea [PE]\tS2_3Dcorr [phd]\n"
         ,0x86,1,_stdout);
  local_3d8 = SUB84(dVar8,0);
  printf("%.6f\t%.6f\t%.6f\t%.0f, %.0f, %.0f\t%d\t%d\t",local_3b8._0_4_,SUB84(local_3e8,0),local_3d8
         ,local_3e0,local_3c0,local_3f0,(ulong)local_2f8 & 0xffffffff,(ulong)local_2f8 >> 0x20);
  if (local_3b8 <= 1000.0) {
    if ((local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[5] <= maxS1) &&
       (local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[7] <= maxS2)) {
      printf("%.6f\t%.6f\t%.6f\t",
             SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2],0),
             SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[5],0),
             SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[7],0));
      printf("%i\t%.6f\t%.6f\n",
             SUB84(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[4],0),
             SUB84(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[7],0),
             (ulong)(uint)(int)*local_380.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      goto LAB_001040c5;
    }
  }
  printf("%e\t%e\t%e\t",
         SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2],0),
         SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[5],0),
         SUB84(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[7],0));
  printf("%lli\t%e\t%e\n",
         SUB84(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[4],0),
         SUB84(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[7],0),
         (long)*local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
LAB_001040c5:
  if (local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((void *)local_368.PhotonYield != (void *)0x0) {
    operator_delete((void *)local_368.PhotonYield,
                    (long)local_368.ExcitonRatio - (long)local_368.PhotonYield);
  }
  if (local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((void *)dVar9 != (void *)0x0) {
    operator_delete((void *)dVar9,(long)dVar10 - (long)dVar9);
  }
  NEST::NESTcalc::~NESTcalc(&local_2a0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  double dayNum = 0.;
  // Give a message establishing the use of this code
  cerr << "NOTE: This is a skeleton code meant to be a starting point for "
          "custom uses of NEST. But you should really look at execNEST."
       << endl
       << endl;

  // Instantiate your own VDetector class here, then load into NEST class
  // constructor
  DetectorExample_LUX_RUN03* detector = new DetectorExample_LUX_RUN03();

  // Construct NEST class using detector object
  NEST::NESTcalc n(detector);

  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(0);

  // Construct NEST objects for storing calculation results
  NEST::YieldResult yields;
  NEST::QuantaResult quanta;

  // Declare needed temporary variables
  vector<double> vTable;
  int index;  // index for Z step (for getting pre-calculated drift field)
  double g2, pos_x, pos_y, pos_z, r, phi, driftTime, field, vD, vD_middle;
  // Energy min and max for source spectrum
  double eMin = 10;
  double eMax = 100;
  // For ion calculations
  double atomNum = 0, massNum = 0;
  // Only necessary for type_num == WIMP
  double wimp_mass_GeV = 1.;

  // Choose a possible interaction type
  INTERACTION_TYPE type_num = NR;
  // INTERACTION_TYPE type_num = WIMP;
  // INTERACTION_TYPE type_num = B8;
  // INTERACTION_TYPE type_num = DD;
  // INTERACTION_TYPE type_num = AmBe;
  // INTERACTION_TYPE type_num = Cf;
  // NOTE: For heavy nuclei or ions, ion requires specification of "atomNum" and
  // "massNum"
  // INTERACTION_TYPE type_num = ion;
  // INTERACTION_TYPE type_num = gammaRay;
  // INTERACTION_TYPE type_num = Kr83m;
  // INTERACTION_TYPE type_num = CH3T;
  // INTERACTION_TYPE type_num = C14;
  // INTERACTION_TYPE type_num = NEST::beta;

  // Do checks for special-case source spectra
  if (type_num == Kr83m) {
    if (eMin == 9.4 && eMax == 9.4) {
    } else if (eMin == 32.1 && eMax == 32.1) {
    } else {
      if (verbosity > 0)
        cerr << "ERROR: For Kr83m, put both energies as 9.4 or both as 32.1 "
                "keV please."
             << endl;
      return 1;
    }
  } else if (type_num == gammaRay && verbosity > 0) {
    if (eMin < 10. || eMax < 10.) {
      cerr << "WARNING: Typically beta model works better for ER BG at low "
              "energies as in a WS."
           << endl;
      cerr << "ER data is often best matched by a weighted average of the beta "
              "& gamma models."
           << endl;
    }
  }

  // Draw an event energy from the appropriate spectrum
  TestSpectra spec;
  double keV = -999.;
  if (eMin == eMax && eMin >= 0. && eMax > 0.)
    keV = eMin;
  else {
    switch (type_num) {
      case CH3T:
        keV = spec.CH3T_spectrum(eMin, eMax);
        break;
      case C14:
        keV = spec.C14_spectrum(eMin, eMax);
        break;
      case B8:  // normalize this to ~3500 / 10-ton / year, for E-threshold of
                // 0.5 keVnr, OR 180 evts/t/yr/keV at 1 keV
        keV = spec.B8_spectrum(eMin, eMax);
        break;
      case AmBe:  // for ZEPLIN-III FSR from HA (Pal '98)
        keV = spec.AmBe_spectrum(eMin, eMax);
        break;
      case Cf:
        keV = spec.Cf_spectrum(eMin, eMax);
        break;
      case DD:
        keV = spec.DD_spectrum(eMin, eMax, 10., 0.1, 60., 25., 0.);
        break;
      case WIMP:
        spec.wimp_spectrum_prep =
            spec.WIMP_prep_spectrum(wimp_mass_GeV, E_step, dayNum);
        keV =
            spec.WIMP_spectrum(spec.wimp_spectrum_prep, wimp_mass_GeV, dayNum);
        break;
      default:
        keV = eMin + (eMax - eMin) * RandomGen::rndm()->rand_uniform();
        break;
    }
  }

  // For most sources, ensure that the energy is in bounds
  if (type_num != WIMP && type_num != B8) {
    if (keV > eMax) keV = eMax;
    if (keV < eMin) keV = eMin;
  }

  // Calculate noble density based on temperature and pressure.
  // Use this to determine whether we are in gas phase
  double rho = n.SetDensity(detector->get_T_Kelvin(),
                            detector->get_p_bar());  // cout.precision(12);
  if (rho < 1.) detector->set_inGas(true);

  // Calculate and print g1, g2 parameters (once per detector)
  vector<double> g2_params = n.CalculateG2();
  g2 = g2_params.back();

  // Calculate a drift velocity table for non-uniform fields,
  // and calculate the drift velocity at detector center for normalization
  // purposes
  vTable = n.SetDriftVelocity_NonUniform(rho, z_step, detector->get_T_Kelvin(), detector->get_p_bar(), pos_x, pos_y);
  vD_middle = vTable[int(
      floor(.5 * (detector->get_gate() - 100. + detector->get_cathode() + 1.5) /
                z_step +
            0.5))];

  // Regenerate a random position for the event until the corresponding drift
  // time is within bounds (drift time uses the cumulative Z-dependent drift
  // velocity)
  driftTime = -999;
  while (driftTime < detector->get_dt_min() ||
         driftTime > detector->get_dt_max() || pos_z <= 0 ||
         pos_z > detector->get_TopDrift()) {
    pos_z = 0. +
            (detector->get_TopDrift() - 0.) * RandomGen::rndm()->rand_uniform();
    r = detector->get_radius() * sqrt(RandomGen::rndm()->rand_uniform());
    phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
    pos_x = r * cos(phi);
    pos_y = r * sin(phi);
    field = detector->FitEF(pos_x, pos_y, pos_z);
    index = int(floor(pos_z / z_step + 0.5));
    vD = vTable[index];
    driftTime =
        (detector->get_TopDrift() - pos_z) / vD;  // (mm - mm) / (mm / us) = us
  }

  // Get yields from NEST calculator, along with number of quanta
  yields =
      n.GetYields(type_num, keV, rho, field, double(massNum), double(atomNum),
                  default_NRYieldsParam, default_ERYieldsParam);
  quanta = n.GetQuanta(yields, rho, default_NRERWidthsParam, -999.);

  // Calculate S2 photons using electron lifetime correction
  double Nphd_S2 =
      g2 * quanta.electrons * exp(-driftTime / detector->get_eLife_us());

  // Vectors for saving times and amplitudes of waveforms (with
  // (S1/S2)CalculationMode set to "Waveform" and the verbosity >= 1 in
  // analysis.hh)
  vector<double> wf_amp;
  vector<int64_t> wf_time;

  double truthPos[3] = {pos_x, pos_y, pos_z};
  double smearPos[3] = {pos_x, pos_y, pos_z};

  // Calculate the S1 based on the quanta generated
  vector<double> scint =
      n.GetS1(quanta, truthPos[0], truthPos[1], truthPos[2], smearPos[0],
              smearPos[1], smearPos[2], vD, vD_middle, type_num, 0, field, keV,
              s1CalculationMode, verbosity, wf_time, wf_amp);

  // Take care of gamma-X case for positions below cathode
  if (truthPos[2] < detector->get_cathode()) quanta.electrons = 0;
  vector<double> scint2 =
      n.GetS2(quanta.electrons, truthPos[0], truthPos[1], truthPos[2],
              smearPos[0], smearPos[1], smearPos[2], driftTime, vD, 0, field,
              s2CalculationMode, verbosity, wf_time, wf_amp, g2_params);

  // If using the reconstructed energy, back-calculate energy as measured from
  // yields
  if (!MCtruthE) {
    double Nph, g1 = detector->get_g1(), Ne;
    if (usePD == 0)
      Nph = std::abs(scint[3]) / (g1 * (1. + detector->get_P_dphe()));
    else if (usePD == 1)
      Nph = std::abs(scint[5]) / g1;
    else
      Nph = std::abs(scint[7]) / g1;

    if (usePD == 0)
      Ne = std::abs(scint2[5]) / (g2 * (1. + detector->get_P_dphe()));
    else
      Ne = std::abs(scint2[7]) / g2;

    if (yields.Lindhard > DBL_MIN && Nph > 0. && Ne > 0.) {
      keV = (Nph + Ne) * W_DEFAULT * 1e-3 / yields.Lindhard;
    } else
      keV = 0.;
  }

  // Possible outputs from "scint" vector
  // scint[0] = nHits; // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  // scint[1] = Nphe; // MC-true integer hits WITH double phe effect (Nphe >
  // nHits)
  // scint[2] = pulseArea; // floating real# smeared DAQ pulse areas in phe, NO
  // XYZ correction
  // scint[3] = pulseAreaC; // smeared DAQ pulse areas in phe, WITH XYZ
  // correction
  // scint[4] = Nphd; // same as pulse area, adjusted/corrected *downward* for
  // 2-PE effect (LUX phd units)
  // scint[5] = NphdC; // same as Nphd, but XYZ-corrected
  // scint[6] = spike; // floating real# spike count, NO XYZ correction
  // scint[7] = spikeC; // floating real# spike count, WITH XYZ correction
  // scint[8] = fdetector->get_g1(); // g1 (light collection efficiency in
  // liquid)

  // Possible outputs from "scint2" vector
  // scint2[0] = Nee; // integer number of electrons unabsorbed in liquid then
  // getting extracted
  // scint2[1] = Nph; // raw number of photons produced in the gas gap
  // scint2[2] = nHits; // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  // scint2[3] = Nphe; // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  //
  // If S2 threshold is set to positive (normal mode)
  // scint2[4] = pulseArea; // floating real# smeared DAQ pulse areas in phe, NO
  // XYZ correction
  // scint2[5] = pulseAreaC; // smeared DAQ pulse areas in phe, WITH XYZ
  // correction
  // scint2[6] = Nphd; // same as pulse area, adjusted/corrected *downward* for
  // 2-PE effect (LUX phd units)
  // scint2[7] = NphdC; // same as Nphd, but XYZ-corrected
  //
  // If S2 threshold is set to negative (switches from S2 -> S2 bottom, NOT
  // literally negative)
  // scint2[4] = S2b; // floating real# smeared pulse areas in phe ONLY
  // including bottom PMTs, NO XYZ correction
  // scint2[5] = S2bc; // floating real# smeared pulse areas in phe ONLY
  // including bottom PMTs, WITH XYZ correction
  // scint2[6] = S2b / (1.+fdetector->get_P_dphe()); // same as S2b, but
  // adjusted for 2-PE effect (LUX phd units)
  // scint2[7] = S2bc / (1.+fdetector->get_P_dphe()); // same as S2bc, but
  // adjusted for 2-PE effect (LUX phd units)
  // scint2[8] = g2; // g2 = ExtEff * SE, light collection efficiency of EL in
  // gas gap (from CalculateG2)

  // Print selected outputs a la execNEST
  fprintf(
      stdout,
      "\nE [keV]\t\tfield [V/cm]\ttDrift [us]\tX,Y,Z [mm]\tNph\tNe-\tS1 [PE "
      "or phe]\tS1_3Dcor [phd]\tS1c_spike\tNe-Extr\tS2_rawArea "
      "[PE]\tS2_3Dcorr [phd]\n");
  printf("%.6f\t%.6f\t%.6f\t%.0f, %.0f, %.0f\t%d\t%d\t", keV, field, driftTime,
         truthPos[0], truthPos[1], truthPos[2], quanta.photons,
         quanta.electrons);  // comment this out when below line in
  // If energy > 1 MeV, switch output notation
  if (keV > 1000. || scint[5] > maxS1 || scint2[7] > maxS2) {
    printf("%e\t%e\t%e\t", scint[2], scint[5], scint[7]);
    printf("%lli\t%e\t%e\n", (long long int)scint2[0], scint2[4], scint2[7]);
  } else {
    printf("%.6f\t%.6f\t%.6f\t", scint[2], scint[5],
           scint[7]);  // see GetS1 inside of NEST.cpp for full explanation of
                       // all 8 scint return vector elements. Sample 3 most
                       // common
    printf("%i\t%.6f\t%.6f\n", (int)scint2[0], scint2[4],
           scint2[7]);  // see GetS2 inside of NEST.cpp for full explanation of
                        // all 8 scint2 vector elements. Change as you desire
  }

  return 0;
}